

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantCollect_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vQuantCis,Vec_Int_t *vQuantSide,
               Vec_Int_t *vQuantAnds)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] != p->nTravIds) {
    p->pTravIds[iObj] = p->nTravIds;
    iVar2 = Gia_ManQuantCheckOverlap(p,iObj);
    p_00 = vQuantSide;
    if (iVar2 != 0) {
      if ((iObj < 0) || (p->nObjs <= iObj)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      uVar3 = (uint)*(undefined8 *)(pGVar1 + (uint)iObj);
      p_00 = vQuantCis;
      if ((~uVar3 & 0x9fffffff) != 0) {
        Gia_ManQuantCollect_rec(p,iObj - (uVar3 & 0x1fffffff),vQuantCis,vQuantSide,vQuantAnds);
        Gia_ManQuantCollect_rec
                  (p,iObj - (*(uint *)&pGVar1[(uint)iObj].field_0x4 & 0x1fffffff),vQuantCis,
                   vQuantSide,vQuantAnds);
        p_00 = vQuantAnds;
      }
    }
    Vec_IntPush(p_00,iObj);
    return;
  }
  return;
}

Assistant:

void Gia_ManQuantCollect_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vQuantCis, Vec_Int_t * vQuantSide, Vec_Int_t * vQuantAnds )
{
    Gia_Obj_t * pObj; 
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    if ( !Gia_ManQuantCheckOverlap(p, iObj) )
    {
        Vec_IntPush( vQuantSide, iObj );
        return;
    }
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vQuantCis, iObj );
        return;
    }
    Gia_ManQuantCollect_rec( p, Gia_ObjFaninId0(pObj, iObj), vQuantCis, vQuantSide, vQuantAnds );
    Gia_ManQuantCollect_rec( p, Gia_ObjFaninId1(pObj, iObj), vQuantCis, vQuantSide, vQuantAnds );
    Vec_IntPush( vQuantAnds, iObj );
}